

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bimap.cpp
# Opt level: O0

void __thiscall BiMap_Size_Test::~BiMap_Size_Test(BiMap_Size_Test *this)

{
  BiMap_Size_Test *this_local;
  
  ~BiMap_Size_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (BiMap, Size) {
    pstore::broker::bimap<int, char> bm;
    EXPECT_EQ (0U, bm.size ());
    bm.set (1, 'a');
    EXPECT_EQ (1U, bm.size ());
    bm.set (1, 'b');
    EXPECT_EQ (1U, bm.size ());
    bm.getl (2);
    EXPECT_EQ (2U, bm.size ());
    bm.getl (2);
    EXPECT_EQ (2U, bm.size ());
}